

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionLexer.cxx
# Opt level: O0

void InsertText(char *upto,char *c,
               vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
               *result)

{
  cmGeneratorExpressionToken local_38;
  vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_> *local_20;
  vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_> *result_local;
  char *c_local;
  char *upto_local;
  
  if (upto != c) {
    local_20 = result;
    result_local = (vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
                    *)c;
    c_local = upto;
    cmGeneratorExpressionToken::cmGeneratorExpressionToken(&local_38,0,upto,(long)c - (long)upto);
    std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::push_back
              (result,&local_38);
  }
  return;
}

Assistant:

static void InsertText(const char* upto, const char* c,
                       std::vector<cmGeneratorExpressionToken>& result)
{
  if (upto != c) {
    result.push_back(cmGeneratorExpressionToken(
      cmGeneratorExpressionToken::Text, upto, c - upto));
  }
}